

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  Module *this_00;
  int iVar1;
  pointer data;
  Command *pCVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char *pcVar5;
  size_type sVar6;
  undefined8 uVar7;
  pointer pEVar8;
  Command *pCVar9;
  Result RVar10;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar11;
  TextScriptModule *pTVar12;
  undefined1 auVar13 [8];
  Index IVar14;
  long lVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 auStack_c8 [8];
  ReadBinaryOptions options;
  undefined1 auStack_68 [8];
  Errors errors;
  Command *local_40;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> command;
  
  pCVar9 = local_40;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RVar10 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                   *)&errors.
                                      super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (RVar10.enum_ == Error) {
    RVar10.enum_ = Error;
    goto LAB_00da63b9;
  }
  MakeUnique<wabt::ModuleCommand>();
  this_00 = (Module *)(local_40 + 1);
  iVar1 = *(int *)&((errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage)->loc).filename.data_;
  if (iVar1 == 0) {
    pTVar12 = cast<wabt::TextScriptModule,wabt::ScriptModule>
                        ((ScriptModule *)
                         errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    Module::operator=(this_00,&pTVar12->module);
LAB_00da633e:
    if (script != (Script *)0x0) {
      IVar14 = (Index)((ulong)((long)(script->commands).
                                     super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(script->commands).
                                    super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (*(long *)&local_40[3].type != 0) {
        uVar3 = *(undefined4 *)&(this_00->loc).filename.data_;
        uVar4 = *(undefined4 *)((long)&local_40[1]._vptr_Command + 4);
        options.features._0_4_ = local_40[1].type;
        options.features.simd_enabled_ = (bool)local_40[1].field_0xc;
        options.features.threads_enabled_ = (bool)local_40[1].field_0xd;
        options.features.multi_value_enabled_ = (bool)local_40[1].field_0xe;
        options.features.tail_call_enabled_ = (bool)local_40[1].field_0xf;
        options._8_8_ = local_40[2]._vptr_Command;
        options.log_stream._0_4_ = local_40[2].type;
        options.log_stream._4_4_ = *(undefined4 *)&local_40[2].field_0xc;
        auStack_c8._0_2_ = (undefined2)uVar3;
        auStack_c8._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
        auStack_c8[4] = SUB41(uVar4,0);
        auStack_c8[5] = SUB41((uint)uVar4 >> 8,0);
        auStack_c8._6_2_ = (undefined2)((uint)uVar4 >> 0x10);
        options._24_4_ = IVar14;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
        ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                    *)&script->module_bindings,local_40 + 3);
      }
      this->last_module_index_ = IVar14;
    }
    local_40 = (Command *)0x0;
    pCVar2 = (out_command->_M_t).
             super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
             super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar9;
    if (pCVar2 == (Command *)0x0) {
      RVar10.enum_ = Ok;
      goto LAB_00da63b9;
    }
    (*pCVar2->_vptr_Command[1])();
    RVar10.enum_ = Ok;
  }
  else {
    if (iVar1 == 1) {
      pDVar11 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>
                          ((ScriptModule *)
                           errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      auStack_c8[0] = false;
      auStack_c8[1] = true;
      auStack_c8[2] = false;
      auStack_c8[3] = false;
      auStack_c8[4] = false;
      auStack_c8[5] = false;
      auStack_c8[6] = false;
      auStack_c8[7] = false;
      options.features._0_4_ = options.features._0_4_ & 0xffffff00;
      options.features.bulk_memory_enabled_ = false;
      options._9_7_ = 0;
      options.log_stream._0_3_ = 0x10100;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_68 = (undefined1  [8])0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data = (pDVar11->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
      ReadBinaryIr("<text>",data,
                   (long)(pDVar11->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)data,
                   (ReadBinaryOptions *)auStack_c8,(Errors *)auStack_68,this_00);
      std::__cxx11::string::_M_assign((string *)(local_40 + 3),(string *)&pDVar11->name);
      pEVar8 = errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar5 = (pDVar11->loc).filename.data_;
      sVar6 = (pDVar11->loc).filename.size_;
      uVar7 = *(undefined8 *)((long)&(pDVar11->loc).field_1 + 8);
      local_40[2]._vptr_Command = (_func_int **)(pDVar11->loc).field_1.field_1.offset;
      *(undefined8 *)&local_40[2].type = uVar7;
      (this_00->loc).filename.data_ = pcVar5;
      *(size_type *)&local_40[1].type = sVar6;
      for (auVar13 = auStack_68; auVar13 != (undefined1  [8])pEVar8;
          auVar13 = (undefined1  [8])((long)auVar13 + 0x48)) {
        if (((pointer)auVar13)->error_level != Error) {
          __assert_fail("error.error_level == ErrorLevel::Error",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                        ,0x8e4,"Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)"
                       );
        }
        if ((((pointer)auVar13)->loc).field_1.field_1.offset == 0xffffffffffffffff) {
          Error(this,0x101f5cb,(((pointer)auVar13)->message)._M_dataplus._M_p);
        }
        else {
          Error(this,0x101f5e6);
        }
      }
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)auStack_68);
      goto LAB_00da633e;
    }
    if (iVar1 != 2) goto LAB_00da633e;
    std::__cxx11::string::string
              ((string *)auStack_c8,"a binary module",
               (allocator *)
               ((long)&command._M_t.
                       super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                       .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 5));
    std::__cxx11::string::string
              ((string *)&options.read_debug_names,"a text module",
               (allocator *)
               ((long)&command._M_t.
                       super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                       .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 6));
    __l._M_len = 2;
    __l._M_array = (iterator)auStack_c8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)auStack_68,__l,
             (allocator_type *)
             ((long)&command._M_t.
                     super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                     .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 7));
    RVar10 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)auStack_68,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_68);
    lVar15 = 0x20;
    do {
      std::__cxx11::string::~string((string *)(auStack_c8 + lVar15));
      lVar15 = lVar15 + -0x20;
    } while (lVar15 != -0x20);
  }
  if (local_40 != (Command *)0x0) {
    (*local_40->_vptr_Command[1])();
  }
LAB_00da63b9:
  if (errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (**(code **)(*(long *)errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 8))();
  }
  return (Result)RVar10.enum_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  auto command = MakeUnique<ModuleCommand>();
  Module& module = command->module;

  switch (script_module->type()) {
    case ScriptModuleType::Text:
      module = std::move(cast<TextScriptModule>(script_module.get())->module);
      break;

    case ScriptModuleType::Binary: {
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, &module);
      module.name = bsm->name;
      module.loc = bsm->loc;
      for (const auto& error: errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module.name.empty()) {
      script->module_bindings.emplace(module.name,
                                      Binding(module.loc, command_index));
    }

    last_module_index_ = command_index;
  }

  *out_command = std::move(command);
  return Result::Ok;
}